

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int __thiscall ReqHandler::init(ReqHandler *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  
  iVar1 = CppJieba::MixSegment::init(&this->_segment,ctx);
  return iVar1;
}

Assistant:

virtual bool do_GET(const HttpReqInfo& httpReq, string& strSnd)
        {
            string sentence, tmp;
            vector<string> words;
            httpReq.GET("key", tmp); 
            URLDecode(tmp, sentence);
            _segment.cut(sentence, words);
            strSnd << words;
            return true;
        }